

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.h
# Opt level: O0

void __thiscall
irr::video::CNullDriver::SHWBufferLink::SHWBufferLink(SHWBufferLink *this,IMeshBuffer *_MeshBuffer)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__SHWBufferLink_0043cd18;
  in_RDI[1] = in_RSI;
  *(undefined4 *)(in_RDI + 2) = 0;
  *(undefined4 *)((long)in_RDI + 0x14) = 0;
  *(undefined4 *)(in_RDI + 3) = 0;
  *(undefined4 *)((long)in_RDI + 0x1c) = 0;
  std::_List_iterator<irr::video::CNullDriver::SHWBufferLink_*>::_List_iterator
            ((_List_iterator<irr::video::CNullDriver::SHWBufferLink_*> *)(in_RDI + 4));
  if (in_RDI[1] != 0) {
    IReferenceCounted::grab
              ((IReferenceCounted *)((long)in_RDI[1] + *(long *)(*(long *)in_RDI[1] + -0x18)));
    (**(code **)(*(long *)in_RDI[1] + 0xd0))();
  }
  return;
}

Assistant:

SHWBufferLink(const scene::IMeshBuffer *_MeshBuffer) :
				MeshBuffer(_MeshBuffer),
				ChangedID_Vertex(0), ChangedID_Index(0),
				Mapped_Vertex(scene::EHM_NEVER), Mapped_Index(scene::EHM_NEVER)
		{
			if (MeshBuffer) {
				MeshBuffer->grab();
				MeshBuffer->setHWBuffer(reinterpret_cast<void *>(this));
			}
		}